

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreePhases_rec(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vMap,int Node,int fPhase,
                        Vec_Bit_t *vVisit)

{
  int i;
  int iVar1;
  uint uVar2;
  int iObj;
  int fPhaseThis;
  int fXorPhase;
  int iXor;
  int iBox;
  int k;
  Vec_Bit_t *vVisit_local;
  int fPhase_local;
  int Node_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  if (Node == 0) {
    __assert_fail("Node != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                  ,0x188,
                  "void Acec_TreePhases_rec(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, Vec_Bit_t *)"
                 );
  }
  i = Vec_IntEntry(vMap,Node);
  if (i != -1) {
    iVar1 = Vec_IntEntry(vAdds,i * 6 + 4);
    if (Node != iVar1) {
      __assert_fail("Node == Vec_IntEntry( vAdds, 6*iBox+4 )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                    ,0x18c,
                    "void Acec_TreePhases_rec(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, Vec_Bit_t *)"
                   );
    }
    iVar1 = Vec_BitEntry(vVisit,i);
    if (iVar1 == 0) {
      Vec_BitWriteEntry(vVisit,i,1);
      Vec_IntEntry(vAdds,i * 6 + 3);
      iObj = Acec_SignBit(vAdds,i,3);
      iVar1 = Vec_IntEntry(vAdds,i * 6 + 2);
      vVisit_local._0_4_ = fPhase;
      if (iVar1 == 0) {
        uVar2 = Acec_SignBit(vAdds,i,2);
        vVisit_local._0_4_ = uVar2 ^ fPhase;
        iObj = (uint)vVisit_local ^ iObj;
        Acec_SignSetBit2(vAdds,i,2,(uint)vVisit_local);
      }
      for (iXor = 0; iXor < 3; iXor = iXor + 1) {
        iVar1 = Vec_IntEntry(vAdds,i * 6 + iXor);
        if (iVar1 != 0) {
          uVar2 = Acec_SignBit(vAdds,i,iXor);
          uVar2 = uVar2 ^ (uint)vVisit_local;
          iObj = uVar2 ^ iObj;
          Acec_TreePhases_rec(p,vAdds,vMap,iVar1,uVar2,vVisit);
          Acec_SignSetBit2(vAdds,i,iXor,uVar2);
        }
      }
      Acec_SignSetBit2(vAdds,i,3,iObj);
      Acec_SignSetBit2(vAdds,i,4,(uint)vVisit_local);
    }
  }
  return;
}

Assistant:

void Acec_TreePhases_rec( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vMap, int Node, int fPhase, Vec_Bit_t * vVisit )
{
    int k, iBox, iXor, fXorPhase, fPhaseThis;
    assert( Node != 0 );
    iBox = Vec_IntEntry( vMap, Node );
    if ( iBox == -1 )
        return;
    assert( Node == Vec_IntEntry( vAdds, 6*iBox+4 ) );
    if ( Vec_BitEntry(vVisit, iBox) )
        return;
    Vec_BitWriteEntry( vVisit, iBox, 1 );
    iXor = Vec_IntEntry( vAdds, 6*iBox+3 );
    fXorPhase = Acec_SignBit(vAdds, iBox, 3);
    if ( Vec_IntEntry(vAdds, 6*iBox+2) == 0 )
    {
        //fPhaseThis = Acec_SignBit( vAdds, iBox, 2 ) ^ fPhase;
        //fXorPhase ^= fPhaseThis;
        //Acec_SignSetBit2( vAdds, iBox, 2, fPhaseThis ); // complemented HADD -- create const1 input
        fPhase ^= Acec_SignBit( vAdds, iBox, 2 );
        fXorPhase ^= fPhase;
        Acec_SignSetBit2( vAdds, iBox, 2, fPhase ); // complemented HADD -- create const1 input
    }
    for ( k = 0; k < 3; k++ )
    {
        int iObj = Vec_IntEntry( vAdds, 6*iBox+k );
        if ( iObj == 0 )
            continue;
        fPhaseThis = Acec_SignBit(vAdds, iBox, k) ^ fPhase;
        fXorPhase ^= fPhaseThis;
        Acec_TreePhases_rec( p, vAdds, vMap, iObj, fPhaseThis, vVisit );
        Acec_SignSetBit2( vAdds, iBox, k, fPhaseThis );
    }
    Acec_SignSetBit2( vAdds, iBox, 3, fXorPhase );
    Acec_SignSetBit2( vAdds, iBox, 4, fPhase );
}